

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double r8_uniform_ab(double a,double b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = *seed;
  if (iVar1 != 0) {
    iVar2 = (iVar1 % 0x1f31d) * 0x41a7;
    iVar1 = (iVar1 / 0x1f31d) * -0xb14;
    iVar3 = iVar2 + iVar1;
    iVar1 = iVar2 + iVar1 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    *seed = iVar1;
    return (b - a) * (double)iVar1 * 4.656612875e-10 + a;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R8_UNIFORM_AB - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
  exit(1);
}

Assistant:

double r8_uniform_ab ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    R8_UNIFORM_AB returns a scaled pseudorandom R8.
//
//  Discussion:
//
//    The pseudorandom number should be uniformly distributed
//    between A and B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 April 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the limits of the interval.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, double R8_UNIFORM_AB, a number strictly between A and B.
//
{
  const int i4_huge = 2147483647;
  int k;
  double value;

  if ( seed == 0 )
  {
    std::cerr << "\n";
    std::cerr << "R8_UNIFORM_AB - Fatal error!\n";
    std::cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }

  k = seed / 127773;

  seed = 16807 * ( seed - k * 127773 ) - k * 2836;

  if ( seed < 0 )
  {
    seed = seed + i4_huge;
  }

  value = double( seed ) * 4.656612875E-10;

  value = a + ( b - a ) * value;

  return value;
}